

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_SQcd_SQcc(opj_j2k_v2_t *p_j2k,OPJ_UINT32 p_comp_no,OPJ_BYTE *p_header_data,
                           OPJ_UINT32 *p_header_size,opj_event_mgr *p_manager)

{
  uint *in_RCX;
  OPJ_BYTE *in_RDX;
  uint in_ESI;
  long in_RDI;
  opj_event_mgr_t *in_R8;
  OPJ_UINT32 l_num_band;
  OPJ_UINT32 l_tmp;
  OPJ_BYTE *l_current_ptr;
  opj_tccp_t *l_tccp;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 l_band_no;
  int local_74;
  uint local_6c;
  long local_68;
  uint local_60;
  uint local_5c;
  OPJ_BYTE *local_58;
  long local_50;
  long local_48;
  long local_40;
  uint local_34;
  opj_event_mgr_t *local_30;
  uint *local_28;
  opj_bool local_4;
  
  local_40 = in_RDI + 0x70;
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_68 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_68 = *(long *)(in_RDI + 0x10);
  }
  local_48 = local_68;
  local_50 = *(long *)(local_68 + 0x15d0) + (ulong)in_ESI * 0x438;
  if (*in_RCX == 0) {
    opj_event_msg_v2(in_R8,1,"Error reading SQcd or SQcc element\n");
    local_4 = 0;
  }
  else {
    *in_RCX = *in_RCX - 1;
    local_58 = in_RDX;
    local_30 = in_R8;
    local_28 = in_RCX;
    opj_read_bytes_LE(in_RDX,&local_5c,1);
    local_58 = local_58 + 1;
    *(uint *)(local_50 + 0x18) = local_5c & 0x1f;
    *(uint *)(local_50 + 0x324) = local_5c >> 5;
    if (*(int *)(local_50 + 0x18) == 1) {
      local_60 = 1;
    }
    else {
      if (*(int *)(local_50 + 0x18) == 0) {
        local_6c = *local_28;
      }
      else {
        local_6c = *local_28 >> 1;
      }
      local_60 = local_6c;
      if (0x61 < local_6c) {
        opj_event_msg_v2(local_30,2,
                         "While reading CCP_QNTSTY element inside QCD or QCC marker segment, number of subbands (%d) is greater to J2K_MAXBANDS (%d). So we limit the number of elements stored to J2K_MAXBANDS (%d) and skip the rest. \n"
                         ,(ulong)local_6c,0x61);
      }
    }
    if (*(int *)(local_50 + 0x18) == 0) {
      for (local_34 = 0; local_34 < local_60; local_34 = local_34 + 1) {
        opj_read_bytes_LE(local_58,&local_5c,1);
        local_58 = local_58 + 1;
        if (local_34 < 0x61) {
          *(uint *)(local_50 + 0x1c + (ulong)local_34 * 8) = local_5c >> 3;
          *(undefined4 *)(local_50 + 0x20 + (ulong)local_34 * 8) = 0;
        }
      }
      *local_28 = *local_28 - local_60;
    }
    else {
      for (local_34 = 0; local_34 < local_60; local_34 = local_34 + 1) {
        opj_read_bytes_LE(local_58,&local_5c,2);
        local_58 = local_58 + 2;
        if (local_34 < 0x61) {
          *(uint *)(local_50 + 0x1c + (ulong)local_34 * 8) = local_5c >> 0xb;
          *(uint *)(local_50 + 0x20 + (ulong)local_34 * 8) = local_5c & 0x7ff;
        }
      }
      *local_28 = *local_28 + local_60 * -2;
    }
    if (*(int *)(local_50 + 0x18) == 1) {
      for (local_34 = 1; local_34 < 0x61; local_34 = local_34 + 1) {
        if (*(uint *)(local_50 + 0x1c) == (local_34 - 1) / 3) {
          local_74 = 0;
        }
        else {
          local_74 = *(int *)(local_50 + 0x1c) - (local_34 - 1) / 3;
        }
        *(int *)(local_50 + 0x1c + (ulong)local_34 * 8) = local_74;
        *(undefined4 *)(local_50 + 0x20 + (ulong)local_34 * 8) = *(undefined4 *)(local_50 + 0x20);
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_SQcd_SQcc(
							opj_j2k_v2_t *p_j2k,
							OPJ_UINT32 p_comp_no,
							OPJ_BYTE* p_header_data,
							OPJ_UINT32 * p_header_size,
							struct opj_event_mgr * p_manager
							)
{
	/* loop*/
	OPJ_UINT32 l_band_no;
	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	opj_tccp_t *l_tccp = 00;
	OPJ_BYTE * l_current_ptr = 00;
	OPJ_UINT32 l_tmp, l_num_band;

	/* preconditions*/
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_header_data != 00);

	l_cp = &(p_j2k->m_cp);
	/* come from tile part header or main header ?*/
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ? /*FIXME J2K_DEC_STATE_TPH*/
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	/* precondition again*/
	assert(p_comp_no <  p_j2k->m_private_image->numcomps);

	l_tccp = &l_tcp->tccps[p_comp_no];
	l_current_ptr = p_header_data;

	if (*p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading SQcd or SQcc element\n");
		return OPJ_FALSE;
	}
	*p_header_size -= 1;

	opj_read_bytes(l_current_ptr, &l_tmp ,1);			/* Sqcx */
	++l_current_ptr;

	l_tccp->qntsty = l_tmp & 0x1f;
	l_tccp->numgbits = l_tmp >> 5;
	if (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) {
        l_num_band = 1;
	}
	else {
		l_num_band = (l_tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) ?
			(*p_header_size) :
			(*p_header_size) / 2;

		if( l_num_band > J2K_MAXBANDS ) {
			opj_event_msg_v2(p_manager, EVT_WARNING, "While reading CCP_QNTSTY element inside QCD or QCC marker segment, "
				"number of subbands (%d) is greater to J2K_MAXBANDS (%d). So we limit the number of elements stored to "
				"J2K_MAXBANDS (%d) and skip the rest. \n", l_num_band, J2K_MAXBANDS, J2K_MAXBANDS);
			/*return OPJ_FALSE;*/
		}
	}

#ifdef USE_JPWL
	if (l_cp->correct) {

		/* if JPWL is on, we check whether there are too many subbands */
		if ((l_num_band < 0) || (l_num_band >= J2K_MAXBANDS)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: bad number of subbands in Sqcx (%d)\n",
				l_num_band);
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
			/* we try to correct */
			l_num_band = 1;
			opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n"
				"- setting number of bands to %d => HYPOTHESIS!!!\n",
				l_num_band);
		};

	};
#endif /* USE_JPWL */

	if (l_tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
		for	(l_band_no = 0; l_band_no < l_num_band; l_band_no++) {
			opj_read_bytes(l_current_ptr, &l_tmp ,1);			/* SPqcx_i */
			++l_current_ptr;
			if (l_band_no < J2K_MAXBANDS){
				l_tccp->stepsizes[l_band_no].expn = l_tmp>>3;
				l_tccp->stepsizes[l_band_no].mant = 0;
			}
		}
		*p_header_size = *p_header_size - l_num_band;
	}
	else {
		for	(l_band_no = 0; l_band_no < l_num_band; l_band_no++) {
			opj_read_bytes(l_current_ptr, &l_tmp ,2);			/* SPqcx_i */
			l_current_ptr+=2;
			if (l_band_no < J2K_MAXBANDS){
				l_tccp->stepsizes[l_band_no].expn = l_tmp >> 11;
				l_tccp->stepsizes[l_band_no].mant = l_tmp & 0x7ff;
			}
		}
		*p_header_size = *p_header_size - 2*l_num_band;
	}

	/* Add Antonin : if scalar_derived -> compute other stepsizes */
	if (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) {
		for (l_band_no = 1; l_band_no < J2K_MAXBANDS; l_band_no++) {
			l_tccp->stepsizes[l_band_no].expn =
				((l_tccp->stepsizes[0].expn) - ((l_band_no - 1) / 3) > 0) ?
					(l_tccp->stepsizes[0].expn) - ((l_band_no - 1) / 3) : 0;
			l_tccp->stepsizes[l_band_no].mant = l_tccp->stepsizes[0].mant;
		}
	}

	return OPJ_TRUE;
}